

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_DrawRailTrail(AActor *source,TArray<SPortalHit,_SPortalHit> *portalhits,int color1,int color2
                    ,double maxdiff,int flags,PClassActor *spawnclass,DAngle *angle,int duration,
                    double sparsity,double drift,int SpiralOffset,DAngle *pitch)

{
  AActor *ent;
  undefined1 auVar1 [8];
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  SPortalHit *pSVar7;
  double *pdVar8;
  TrailSegment *pTVar9;
  TrailSegment *pTVar10;
  particle_t *this;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int local_6a4;
  uint32 local_688;
  int local_61c;
  uint32 local_604;
  TVector3<double> local_4f0;
  TVector3<double> local_4d8;
  TVector3<double> local_4c0;
  TVector3<double> local_4a8;
  AActor *local_490;
  AActor *thing;
  undefined1 auStack_480 [4];
  int rnd_1;
  DVector3 diff_1;
  int trail_steps_1;
  double stepsize_2;
  TVector3<double> local_440;
  int local_424;
  undefined1 local_420 [4];
  int rand_1;
  undefined1 local_408 [8];
  DVector3 postmp;
  int rnd;
  particle_t *p_1;
  undefined1 auStack_3d8 [4];
  int innerduration;
  DVector3 diff;
  int trail_steps;
  double stepsize_1;
  TVector3<double> local_398;
  int local_37c;
  undefined1 local_378 [4];
  int rand;
  TVector3<double> local_360;
  TVector3<double> local_348;
  TVector3<double> local_330;
  TAngle<double> local_318;
  TMatrix3x3<double> local_310;
  Vector3 local_2c8;
  int local_2ac;
  undefined1 local_2a8 [4];
  int spiralduration;
  DVector3 tempvec_1;
  particle_t *p;
  int spiral_steps;
  double stepsize;
  TVector3<double> local_270;
  TrailSegment *local_258;
  TrailSegment *seg_1;
  iterator __end4;
  iterator __begin4;
  TArray<TrailSegment,_TrailSegment> *__range4;
  TrailSegment *shortest;
  AActor *local_228;
  AActor *mo_1;
  undefined1 local_218 [4];
  FSoundID sound;
  TVector2<double> local_200;
  TVector3<double> local_1f0;
  TVector3<double> local_1d8;
  TVector2<double> local_1c0;
  double local_1b0;
  double r;
  AActor *mo;
  TVector3<double> local_188;
  TVector3<double> local_170;
  undefined1 local_158 [8];
  DVector3 tempvec;
  int ii;
  int epos;
  double minelem;
  undefined1 local_118 [8];
  TrailSegment seg;
  double dStack_a8;
  uint i_1;
  double lencount;
  uint segment;
  bool fullbright;
  DVector3 pos;
  TAngle<double> local_70;
  TAngle<double> deg;
  TArray<TrailSegment,_TrailSegment> trail;
  int i;
  int steps;
  double length;
  double drift_local;
  double sparsity_local;
  PClassActor *spawnclass_local;
  int flags_local;
  double maxdiff_local;
  int color2_local;
  int color1_local;
  TArray<SPortalHit,_SPortalHit> *portalhits_local;
  AActor *source_local;
  
  _i = 0.0;
  TArray<TrailSegment,_TrailSegment>::TArray((TArray<TrailSegment,_TrailSegment> *)&deg);
  TAngle<double>::TAngle(&local_70);
  TVector3<double>::TVector3((TVector3<double> *)&segment);
  for (seg.sounddist._4_4_ = 0; uVar6 = seg.sounddist._4_4_,
      uVar3 = TArray<SPortalHit,_SPortalHit>::Size(portalhits), uVar6 < uVar3 - 1;
      seg.sounddist._4_4_ = seg.sounddist._4_4_ + 1) {
    TrailSegment::TrailSegment((TrailSegment *)local_118);
    pSVar7 = TArray<SPortalHit,_SPortalHit>::operator[](portalhits,(ulong)seg.sounddist._4_4_);
    TVector3<double>::operator=((TVector3<double> *)local_118,&pSVar7->ContPos);
    pSVar7 = TArray<SPortalHit,_SPortalHit>::operator[](portalhits,(ulong)seg.sounddist._4_4_);
    TVector3<double>::operator=((TVector3<double> *)&seg.start.Z,&pSVar7->OutDir);
    pSVar7 = TArray<SPortalHit,_SPortalHit>::operator[](portalhits,(ulong)(seg.sounddist._4_4_ + 1))
    ;
    TVector3<double>::operator-
              ((TVector3<double> *)&minelem,&pSVar7->HitPos,(TVector3<double> *)local_118);
    seg.soundpos.Y = TVector3<double>::Length((TVector3<double> *)&minelem);
    _ii = 1.0;
    tempvec.Z._4_4_ = 0;
    for (tempvec.Z._0_4_ = 0; tempvec.Z._0_4_ < 3; tempvec.Z._0_4_ = tempvec.Z._0_4_ + 1) {
      pdVar8 = TVector3<double>::operator[]((TVector3<double> *)&seg.start.Z,tempvec.Z._0_4_);
      if (ABS(*pdVar8) < _ii) {
        tempvec.Z._4_4_ = tempvec.Z._0_4_;
        pdVar8 = TVector3<double>::operator[]((TVector3<double> *)&seg.start.Z,tempvec.Z._0_4_);
        _ii = ABS(*pdVar8);
      }
    }
    TVector3<double>::TVector3((TVector3<double> *)local_158,0.0,0.0,0.0);
    pdVar8 = TVector3<double>::operator[]((TVector3<double> *)local_158,tempvec.Z._4_4_);
    *pdVar8 = 1.0;
    dVar12 = TVector3<double>::operator|
                       ((TVector3<double> *)&seg.start.Z,(TVector3<double> *)local_158);
    operator*((TVector3<double> *)&mo,dVar12,(TVector3<double> *)&seg.start.Z);
    TVector3<double>::operator-(&local_188,(TVector3<double> *)local_158,(TVector3<double> *)&mo);
    operator*(&local_170,&local_188,3.0);
    TVector3<double>::operator=((TVector3<double> *)&seg.dir.Z,&local_170);
    _i = _i + seg.soundpos.Y;
    r = (double)TObjPtr::operator_cast_to_AActor_
                          ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    dVar12 = seg.start.X;
    dVar13 = AActor::Y((AActor *)r);
    auVar1 = local_118;
    dVar15 = -seg.dir.X;
    dVar14 = AActor::X((AActor *)r);
    local_1b0 = ((dVar12 - dVar13) * dVar15 - ((double)auVar1 - dVar14) * seg.start.Z) /
                (seg.soundpos.Y * seg.soundpos.Y);
    local_1b0 = clamp<double>(local_1b0,0.0,1.0);
    operator*(&local_1f0,local_1b0,(TVector3<double> *)&seg.start.Z);
    TVector3<double>::operator+(&local_1d8,(TVector3<double> *)local_118,&local_1f0);
    TVector2<double>::TVector2(&local_1c0,&local_1d8);
    TVector2<double>::operator=((TVector2<double> *)&seg.extend.Z,&local_1c0);
    AActor::Pos((DVector3 *)local_218,(AActor *)r);
    operator-(&local_200,(TVector3<double> *)&seg.extend.Z);
    seg.length = TVector2<double>::LengthSquared(&local_200);
    TArray<TrailSegment,_TrailSegment>::Push
              ((TArray<TrailSegment,_TrailSegment> *)&deg,(TrailSegment *)local_118);
  }
  iVar4 = xs_FloorToInt((real64)(_i / 3.0),0.499999985);
  bVar11 = (flags & 8U) != 0;
  if (iVar4 == 0) {
    stepsize._0_4_ = 1;
    goto LAB_0063b4cc;
  }
  if ((flags & 1U) == 0) {
    FSoundID::FSoundID((FSoundID *)((long)&mo_1 + 4));
    if (source->player == (player_t *)0x0) {
      FSoundID::operator=((FSoundID *)((long)&mo_1 + 4),&(source->AttackSound).super_FSoundID);
    }
    else if (source->player->ReadyWeapon == (AWeapon *)0x0) {
      FSoundID::operator=((FSoundID *)((long)&mo_1 + 4),(char *)0x0);
    }
    else {
      FSoundID::operator=((FSoundID *)((long)&mo_1 + 4),
                          &(source->player->ReadyWeapon->super_AInventory).super_AActor.AttackSound.
                           super_FSoundID);
    }
    iVar5 = FSoundID::operator_cast_to_int((FSoundID *)((long)&mo_1 + 4));
    if (iVar5 == 0) {
      FSoundID::operator=((FSoundID *)((long)&mo_1 + 4),"weapons/railgf");
    }
    local_228 = TObjPtr::operator_cast_to_AActor_
                          ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    dVar12 = AActor::X(local_228);
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    if (ABS(dVar12 - (pTVar9->start).X) < 20.0) {
      dVar12 = AActor::Y(local_228);
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
      ent = local_228;
      if (ABS(dVar12 - (pTVar9->start).Y) < 20.0) {
        FSoundID::FSoundID((FSoundID *)((long)&shortest + 4),(FSoundID *)((long)&mo_1 + 4));
        S_Sound(ent,1,(FSoundID *)((long)&shortest + 4),1.0,1.0);
        goto LAB_0063a40f;
      }
    }
    __range4 = (TArray<TrailSegment,_TrailSegment> *)0x0;
    __end4 = TArray<TrailSegment,_TrailSegment>::begin((TArray<TrailSegment,_TrailSegment> *)&deg);
    seg_1 = (TrailSegment *)
            TArray<TrailSegment,_TrailSegment>::end((TArray<TrailSegment,_TrailSegment> *)&deg);
    while (bVar2 = TIterator<TrailSegment>::operator!=(&__end4,(TIterator<TrailSegment> *)&seg_1),
          bVar2) {
      local_258 = TIterator<TrailSegment>::operator*(&__end4);
      if ((__range4 == (TArray<TrailSegment,_TrailSegment> *)0x0) ||
         (local_258->sounddist <= (double)__range4[6].Array &&
          (double)__range4[6].Array != local_258->sounddist)) {
        __range4 = (TArray<TrailSegment,_TrailSegment> *)local_258;
      }
      TIterator<TrailSegment>::operator++(&__end4);
    }
    TVector3<double>::TVector3(&local_270,(Vector2 *)&__range4[4].Most,ViewPos.Z);
    FSoundID::FSoundID((FSoundID *)((long)&stepsize + 4),(FSoundID *)((long)&mo_1 + 4));
    S_Sound(&local_270,1,(FSoundID *)((long)&stepsize + 4),1.0,1.0);
  }
LAB_0063a40f:
  maxdiff_local._4_4_ = color1;
  if (((color1 != -1) &&
      (((bVar2 = FBoolCVar::operator_cast_to_bool(&r_rail_smartspiral), !bVar2 || (color2 == -1)) &&
       (iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity), 0 < iVar5)))) &&
     (spawnclass == (PClassActor *)0x0)) {
    iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity);
    dVar12 = (double)(iVar5 * 3) * sparsity;
    iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity);
    trail.Most = (uint)((double)(iVar4 * iVar5) / sparsity);
    lencount._0_4_ = 0;
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    dStack_a8 = pTVar9->length;
    if (color1 == 0) {
      local_604 = 0xffffffff;
    }
    else {
      local_604 = ParticleColor(color1);
    }
    maxdiff_local._4_4_ = local_604;
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    TVector3<double>::operator=((TVector3<double> *)&segment,&pTVar9->start);
    TAngle<double>::operator=(&local_70,(double)SpiralOffset);
    for (; trail.Most != 0; trail.Most = trail.Most - 1) {
      tempvec_1.Z = (double)NewParticle();
      TVector3<double>::TVector3((TVector3<double> *)local_2a8);
      if (tempvec_1.Z == 0.0) {
        stepsize._0_4_ = 1;
        goto LAB_0063b4cc;
      }
      if (duration == 0) {
        local_61c = 0x23;
      }
      else {
        local_61c = duration;
      }
      local_2ac = local_61c;
      *(undefined1 *)((long)tempvec_1.Z + 0x49) = 0xff;
      *(undefined1 *)((long)tempvec_1.Z + 0x48) = (undefined1)duration;
      *(char *)((long)tempvec_1.Z + 0x61) = (char)(0xff / (long)local_61c);
      *(undefined8 *)((long)tempvec_1.Z + 0x50) = 0x4008000000000000;
      *(bool *)((long)tempvec_1.Z + 0x60) = bVar11;
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
      TAngle<double>::TAngle(&local_318,&local_70);
      TMatrix3x3<double>::TMatrix3x3(&local_310,&pTVar9->dir,&local_318);
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
      operator*(&local_2c8,&local_310,&pTVar9->extend);
      TVector3<double>::operator=((TVector3<double> *)local_2a8,&local_2c8);
      operator*(&local_348,(TVector3<double> *)local_2a8,drift);
      TVector3<double>::operator/(&local_330,&local_348,16.0);
      TVector3<double>::operator=((TVector3<double> *)((long)tempvec_1.Z + 0x18),&local_330);
      TVector3<double>::operator+
                (&local_360,(TVector3<double> *)local_2a8,(TVector3<double> *)&segment);
      TVector3<double>::operator=((TVector3<double> *)tempvec_1.Z,&local_360);
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
      operator*((TVector3<double> *)local_378,&pTVar9->dir,dVar12);
      TVector3<double>::operator+=((TVector3<double> *)&segment,(TVector3<double> *)local_378);
      iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity);
      TAngle<double>::operator+=(&local_70,(double)(iVar5 * 0xe));
      dStack_a8 = dStack_a8 - dVar12;
      if (local_604 == 0xffffffff) {
        local_37c = FRandom::operator()(&M_Random);
        if (local_37c < 0x9b) {
          *(int *)((long)tempvec_1.Z + 100) = rblue2;
        }
        else if (local_37c < 0xbc) {
          *(int *)((long)tempvec_1.Z + 100) = rblue1;
        }
        else if (local_37c < 0xde) {
          *(int *)((long)tempvec_1.Z + 100) = rblue3;
        }
        else {
          *(int *)((long)tempvec_1.Z + 100) = rblue4;
        }
      }
      else {
        *(uint32 *)((long)tempvec_1.Z + 100) = local_604;
      }
      if (dStack_a8 <= 0.0) {
        lencount._0_4_ = lencount._0_4_ + 1;
        uVar6 = TArray<TrailSegment,_TrailSegment>::Size((TArray<TrailSegment,_TrailSegment> *)&deg)
        ;
        if (uVar6 <= lencount._0_4_) break;
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        pTVar10 = TArray<TrailSegment,_TrailSegment>::operator[]
                            ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        operator*((TVector3<double> *)&stepsize_1,&pTVar10->dir,dStack_a8);
        TVector3<double>::operator-(&local_398,&pTVar9->start,(TVector3<double> *)&stepsize_1);
        TVector3<double>::operator=((TVector3<double> *)&segment,&local_398);
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        dStack_a8 = pTVar9->length + dStack_a8;
      }
    }
  }
  if (((color2 != -1) && (iVar5 = FIntCVar::operator_cast_to_int(&r_rail_trailsparsity), 0 < iVar5))
     && (spawnclass == (PClassActor *)0x0)) {
    iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity);
    dVar12 = (double)(iVar5 * 3) * sparsity;
    iVar5 = FIntCVar::operator_cast_to_int(&r_rail_trailsparsity);
    diff.Z._4_4_ = xs_FloorToInt((real64)((double)(iVar4 * iVar5) / sparsity),0.499999985);
    if (color2 == 0) {
      local_688 = 0xffffffff;
    }
    else {
      local_688 = ParticleColor(color2);
    }
    TVector3<double>::TVector3((TVector3<double> *)auStack_3d8,0.0,0.0,0.0);
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    TVector3<double>::operator=((TVector3<double> *)&segment,&pTVar9->start);
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    dStack_a8 = pTVar9->length;
    lencount._0_4_ = 0;
    for (trail.Most = diff.Z._4_4_; trail.Most != 0; trail.Most = trail.Most - 1) {
      if (duration == 0) {
        local_6a4 = 0x21;
      }
      else {
        local_6a4 = duration;
      }
      this = JitterParticle(local_6a4,(double)(float)drift);
      if (this == (particle_t *)0x0) {
        stepsize._0_4_ = 1;
        goto LAB_0063b4cc;
      }
      if (0.0 < maxdiff) {
        postmp.Z._4_4_ = FRandom::operator()(&M_Random);
        if ((postmp.Z._4_4_ & 1) != 0) {
          _auStack_3d8 = clamp<double>(_auStack_3d8 +
                                       (double)(int)(-(uint)((postmp.Z._4_4_ & 8) == 0) | 1),
                                       -maxdiff,maxdiff);
        }
        if ((postmp.Z._4_4_ & 2) != 0) {
          diff.X = clamp<double>(diff.X + (double)(int)(-(uint)((postmp.Z._4_4_ & 0x10) == 0) | 1),
                                 -maxdiff,maxdiff);
        }
        if ((postmp.Z._4_4_ & 4) != 0) {
          diff.Y = clamp<double>(diff.Y + (double)(int)(-(uint)((postmp.Z._4_4_ & 0x20) == 0) | 1),
                                 -maxdiff,maxdiff);
        }
      }
      TVector3<double>::operator+
                ((TVector3<double> *)local_408,(TVector3<double> *)&segment,
                 (TVector3<double> *)auStack_3d8);
      this->size = 2.0;
      TVector3<double>::operator=(&this->Pos,(TVector3<double> *)local_408);
      if (maxdiff_local._4_4_ != 0xffffffff) {
        (this->Acc).Z = (this->Acc).Z - 0.000244140625;
      }
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
      operator*((TVector3<double> *)local_420,&pTVar9->dir,dVar12);
      TVector3<double>::operator+=((TVector3<double> *)&segment,(TVector3<double> *)local_420);
      dStack_a8 = dStack_a8 - dVar12;
      this->bright = bVar11;
      if (local_688 == 0xffffffff) {
        local_424 = FRandom::operator()(&M_Random);
        if (local_424 < 0x55) {
          this->color = grey4;
        }
        else if (local_424 < 0xaa) {
          this->color = grey2;
        }
        else {
          this->color = grey1;
        }
      }
      else {
        this->color = local_688;
      }
      if (dStack_a8 <= 0.0) {
        lencount._0_4_ = lencount._0_4_ + 1;
        uVar6 = TArray<TrailSegment,_TrailSegment>::Size((TArray<TrailSegment,_TrailSegment> *)&deg)
        ;
        if (uVar6 <= lencount._0_4_) break;
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        pTVar10 = TArray<TrailSegment,_TrailSegment>::operator[]
                            ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        operator*((TVector3<double> *)&stepsize_2,&pTVar10->dir,dStack_a8);
        TVector3<double>::operator-(&local_440,&pTVar9->start,(TVector3<double> *)&stepsize_2);
        TVector3<double>::operator=((TVector3<double> *)&segment,&local_440);
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        dStack_a8 = pTVar9->length + dStack_a8;
      }
    }
  }
  if (spawnclass != (PClassActor *)0x0) {
    drift_local = sparsity;
    if (sparsity < 1.0) {
      drift_local = 32.0;
    }
    iVar5 = FIntCVar::operator_cast_to_int(&r_rail_spiralsparsity);
    dVar12 = (double)(iVar5 * 3) * drift_local;
    diff_1.Z._4_4_ = (uint)((double)(iVar4 * 3) / drift_local);
    TVector3<double>::TVector3((TVector3<double> *)auStack_480,0.0,0.0,0.0);
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    TVector3<double>::operator=((TVector3<double> *)&segment,&pTVar9->start);
    pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                       ((TArray<TrailSegment,_TrailSegment> *)&deg,0);
    dStack_a8 = pTVar9->length;
    lencount._0_4_ = 0;
    for (trail.Most = diff_1.Z._4_4_; trail.Most != 0; trail.Most = trail.Most - 1) {
      if (0.0 < maxdiff) {
        thing._4_4_ = FRandom::operator()(&pr_railtrail);
        if ((thing._4_4_ & 1) != 0) {
          _auStack_480 = clamp<double>(_auStack_480 +
                                       (double)(int)(-(uint)((thing._4_4_ & 8) == 0) | 1),-maxdiff,
                                       maxdiff);
        }
        if ((thing._4_4_ & 2) != 0) {
          diff_1.X = clamp<double>(diff_1.X + (double)(int)(-(uint)((thing._4_4_ & 0x10) == 0) | 1),
                                   -maxdiff,maxdiff);
        }
        if ((thing._4_4_ & 4) != 0) {
          diff_1.Y = clamp<double>(diff_1.Y + (double)(int)(-(uint)((thing._4_4_ & 0x20) == 0) | 1),
                                   -maxdiff,maxdiff);
        }
      }
      TVector3<double>::operator+
                (&local_4a8,(TVector3<double> *)&segment,(TVector3<double> *)auStack_480);
      local_490 = Spawn(spawnclass,&local_4a8,ALLOW_REPLACE);
      if (local_490 != (AActor *)0x0) {
        if (source != (AActor *)0x0) {
          TObjPtr<AActor>::operator=(&local_490->target,source);
        }
        TAngle<double>::operator=(&(local_490->Angles).Pitch,pitch);
        TAngle<double>::operator=(&(local_490->Angles).Yaw,angle);
      }
      pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                         ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
      operator*(&local_4c0,&pTVar9->dir,dVar12);
      TVector3<double>::operator+=((TVector3<double> *)&segment,&local_4c0);
      dStack_a8 = dStack_a8 - dVar12;
      if (dStack_a8 <= 0.0) {
        lencount._0_4_ = lencount._0_4_ + 1;
        uVar6 = TArray<TrailSegment,_TrailSegment>::Size((TArray<TrailSegment,_TrailSegment> *)&deg)
        ;
        if (uVar6 <= lencount._0_4_) break;
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        pTVar10 = TArray<TrailSegment,_TrailSegment>::operator[]
                            ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        operator*(&local_4f0,&pTVar10->dir,dStack_a8);
        TVector3<double>::operator-(&local_4d8,&pTVar9->start,&local_4f0);
        TVector3<double>::operator=((TVector3<double> *)&segment,&local_4d8);
        pTVar9 = TArray<TrailSegment,_TrailSegment>::operator[]
                           ((TArray<TrailSegment,_TrailSegment> *)&deg,(ulong)lencount._0_4_);
        dStack_a8 = pTVar9->length + dStack_a8;
      }
    }
  }
  stepsize._0_4_ = 0;
LAB_0063b4cc:
  TArray<TrailSegment,_TrailSegment>::~TArray((TArray<TrailSegment,_TrailSegment> *)&deg);
  return;
}

Assistant:

void P_DrawRailTrail(AActor *source, TArray<SPortalHit> &portalhits, int color1, int color2, double maxdiff, int flags, PClassActor *spawnclass, DAngle angle, int duration, double sparsity, double drift, int SpiralOffset, DAngle pitch)
{
	double length = 0;
	int steps, i;
	TArray<TrailSegment> trail;
	TAngle<double> deg;
	DVector3 pos;
	bool fullbright;
	unsigned segment;
	double lencount;

	for (unsigned i = 0; i < portalhits.Size() - 1; i++)
	{
		TrailSegment seg;

		seg.start = portalhits[i].ContPos;
		seg.dir = portalhits[i].OutDir;
		seg.length = (portalhits[i + 1].HitPos - seg.start).Length();

		//Calculate PerpendicularVector (extend, dir):
		double minelem = 1;
		int epos;
		int ii;
		for (epos = 0, ii = 0; ii < 3; ++ii)
		{
			if (fabs(seg.dir[ii]) < minelem)
			{
				epos = ii;
				minelem = fabs(seg.dir[ii]);
			}
		}
		DVector3 tempvec(0, 0, 0);
		tempvec[epos] = 1;
		seg.extend = (tempvec - (seg.dir | tempvec) * seg.dir) * 3;
		length += seg.length;

		// Only consider sound in 2D (for now, anyway)
		// [BB] You have to divide by lengthsquared here, not multiply with it.
		AActor *mo = players[consoleplayer].camera;

		double r = ((seg.start.Y - mo->Y()) * (-seg.dir.Y) - (seg.start.X - mo->X()) * (seg.dir.X)) / (seg.length * seg.length);
		r = clamp<double>(r, 0., 1.);
		seg.soundpos = seg.start + r * seg.dir;
		seg.sounddist = (seg.soundpos - mo->Pos()).LengthSquared();
		trail.Push(seg);
	}

	steps = xs_FloorToInt(length / 3);
	fullbright = !!(flags & RAF_FULLBRIGHT);

	if (steps)
	{
		if (!(flags & RAF_SILENT))
		{
			FSoundID sound;
			
			// Allow other sounds than 'weapons/railgf'!
			if (!source->player) sound = source->AttackSound;
			else if (source->player->ReadyWeapon) sound = source->player->ReadyWeapon->AttackSound;
			else sound = 0;
			if (!sound) sound = "weapons/railgf";

			// The railgun's sound is special. It gets played from the
			// point on the slug's trail that is closest to the hearing player.
			AActor *mo = players[consoleplayer].camera;

			if (fabs(mo->X() - trail[0].start.X) < 20 && fabs(mo->Y() - trail[0].start.Y) < 20)
			{ // This player (probably) fired the railgun
				S_Sound (mo, CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
			else
			{
				TrailSegment *shortest = NULL;
				for (auto &seg : trail)
				{
					if (shortest == NULL || shortest->sounddist > seg.sounddist) shortest = &seg;
				}
				S_Sound (DVector3(shortest->soundpos, ViewPos.Z), CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
		}
	}
	else
	{
		// line is 0 length, so nothing to do
		return;
	}

	// Create the outer spiral.
	if (color1 != -1 && (!r_rail_smartspiral || color2 == -1) && r_rail_spiralsparsity > 0 && (spawnclass == NULL))
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int spiral_steps = (int)(steps * r_rail_spiralsparsity / sparsity);
		segment = 0;
		lencount = trail[0].length;
		
		color1 = color1 == 0 ? -1 : ParticleColor(color1);
		pos = trail[0].start;
		deg = (double)SpiralOffset;
		for (i = spiral_steps; i; i--)
		{
			particle_t *p = NewParticle ();
			DVector3 tempvec;

			if (!p)
				return;

			int spiralduration = (duration == 0) ? 35 : duration;

			p->trans = 255;
			p->ttl = duration;
			p->fade = FADEFROMTTL(spiralduration);
			p->size = 3;
			p->bright = fullbright;

			tempvec = DMatrix3x3(trail[segment].dir, deg) * trail[segment].extend;
			p->Vel = tempvec * drift / 16.;
			p->Pos = tempvec + pos;
			pos += trail[segment].dir * stepsize;
			deg += double(r_rail_spiralsparsity * 14);
			lencount -= stepsize;
			if (color1 == -1)
			{
				int rand = M_Random();

				if (rand < 155)
					p->color = rblue2;
				else if (rand < 188)
					p->color = rblue1;
				else if (rand < 222)
					p->color = rblue3;
				else
					p->color = rblue4;
			}
			else 
			{
				p->color = color1;
			}

			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}

	// Create the inner trail.
	if (color2 != -1 && r_rail_trailsparsity > 0 && spawnclass == NULL)
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = xs_FloorToInt(steps * r_rail_trailsparsity / sparsity);

		color2 = color2 == 0 ? -1 : ParticleColor(color2);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;
		for (i = trail_steps; i; i--)
		{
			// [XA] inner trail uses a different default duration (33).
			int innerduration = (duration == 0) ? 33 : duration;
			particle_t *p = JitterParticle (innerduration, (float)drift);

			if (!p)
				return;

			if (maxdiff > 0)
			{
				int rnd = M_Random ();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}

			DVector3 postmp = pos + diff;

			p->size = 2;
			p->Pos = postmp;
			if (color1 != -1)
				p->Acc.Z -= 1./4096;
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			p->bright = fullbright;

			if (color2 == -1)
			{
				int rand = M_Random();

				if (rand < 85)
					p->color = grey4;
				else if (rand < 170)
					p->color = grey2;
				else
					p->color = grey1;
			}
			else 
			{
				p->color = color2;
			}
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}

		}
	}
	// create actors
	if (spawnclass != NULL)
	{
		if (sparsity < 1)
			sparsity = 32;

		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = (int)((steps * 3) / sparsity);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;

		for (i = trail_steps; i; i--)
		{
			if (maxdiff > 0)
			{
				int rnd = pr_railtrail();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}			
			AActor *thing = Spawn (spawnclass, pos + diff, ALLOW_REPLACE);
			if (thing)
			{
				if (source)	thing->target = source;
				thing->Angles.Pitch = pitch;
				thing->Angles.Yaw = angle;
			}
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}
}